

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

bool ev3dev::button::process_all(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  bVar1 = process((button *)back);
  bVar2 = process((button *)left);
  bVar3 = process((button *)right);
  bVar4 = process((button *)up);
  bVar5 = process((button *)down);
  bVar6 = process((button *)enter);
  return (bVar6 || bVar5) || ((bVar4 || bVar3) || (bVar2 || bVar1));
}

Assistant:

bool button::process_all() {
    std::array<bool, 6> changed{{
        back. process(),
            left. process(),
            right.process(),
            up.   process(),
            down. process(),
            enter.process()
    }};
    return std::any_of(changed.begin(), changed.end(), [](bool c){ return c; });
}